

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_XScream(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  FSoundID *sound_id;
  AActor *ent;
  char *__assertion;
  bool bVar4;
  FSoundID FStack_18;
  FSoundID local_14;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  sound_id = &FStack_18;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003f691a;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent != (AActor *)0x0) {
        pPVar3 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (ent->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar4) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar4 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f691a;
        }
        goto LAB_003f68ba;
      }
    }
    else if (ent != (AActor *)0x0) goto LAB_003f690a;
    ent = (AActor *)0x0;
LAB_003f68ba:
    if (ent->player == (player_t *)0x0) {
      iVar2 = S_FindSound("misc/gibbed");
    }
    else {
      iVar2 = S_FindSound("*gibbed");
      sound_id = &local_14;
    }
    sound_id->ID = iVar2;
    S_Sound(ent,2,sound_id,1.0,1.0);
    return 0;
  }
LAB_003f690a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003f691a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc75,"int AF_AActor_A_XScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_XScream)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->player)
		S_Sound (self, CHAN_VOICE, "*gibbed", 1, ATTN_NORM);
	else
		S_Sound (self, CHAN_VOICE, "misc/gibbed", 1, ATTN_NORM);
	return 0;
}